

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_scalar_set_b32_seckey_tests(void)

{
  int iVar1;
  secp256k1_scalar s2;
  secp256k1_scalar s1;
  uchar b32 [32];
  secp256k1_scalar *in_stack_ffffffffffffff98;
  secp256k1_scalar *in_stack_ffffffffffffffa0;
  uchar *in_stack_ffffffffffffffa8;
  secp256k1_scalar *in_stack_ffffffffffffffb0;
  undefined1 local_28 [40];
  
  testutil_random_scalar_order_b32((uchar *)in_stack_ffffffffffffffb0);
  secp256k1_scalar_set_b32
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(int *)in_stack_ffffffffffffffa0);
  iVar1 = secp256k1_scalar_set_b32_seckey
                    (in_stack_ffffffffffffffa0,(uchar *)in_stack_ffffffffffffff98);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x877,"test condition failed: secp256k1_scalar_set_b32_seckey(&s2, b32) == 1");
    abort();
  }
  iVar1 = secp256k1_scalar_eq(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x878,"test condition failed: secp256k1_scalar_eq(&s1, &s2) == 1");
    abort();
  }
  memset(local_28,0,0x20);
  iVar1 = secp256k1_scalar_set_b32_seckey
                    (in_stack_ffffffffffffffa0,(uchar *)in_stack_ffffffffffffff98);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x87b,"test condition failed: secp256k1_scalar_set_b32_seckey(&s2, b32) == 0");
    abort();
  }
  memset(local_28,0xff,0x20);
  iVar1 = secp256k1_scalar_set_b32_seckey
                    (in_stack_ffffffffffffffa0,(uchar *)in_stack_ffffffffffffff98);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x87d,"test condition failed: secp256k1_scalar_set_b32_seckey(&s2, b32) == 0");
    abort();
  }
  return;
}

Assistant:

static void run_scalar_set_b32_seckey_tests(void) {
    unsigned char b32[32];
    secp256k1_scalar s1;
    secp256k1_scalar s2;

    /* Usually set_b32 and set_b32_seckey give the same result */
    testutil_random_scalar_order_b32(b32);
    secp256k1_scalar_set_b32(&s1, b32, NULL);
    CHECK(secp256k1_scalar_set_b32_seckey(&s2, b32) == 1);
    CHECK(secp256k1_scalar_eq(&s1, &s2) == 1);

    memset(b32, 0, sizeof(b32));
    CHECK(secp256k1_scalar_set_b32_seckey(&s2, b32) == 0);
    memset(b32, 0xFF, sizeof(b32));
    CHECK(secp256k1_scalar_set_b32_seckey(&s2, b32) == 0);
}